

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_sqr(void)

{
  int i;
  secp256k1_fe s;
  secp256k1_fe x;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int a;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  
  secp256k1_fe_set_int(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  secp256k1_fe_negate_unchecked
            (in_stack_ffffffffffffffa0,
             (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  for (a = 1; a < 0x201; a = a + 1) {
    secp256k1_fe_mul_int_unchecked(in_stack_ffffffffffffffa0,a);
    secp256k1_fe_normalize((secp256k1_fe *)0x116632);
    secp256k1_fe_sqr(in_stack_ffffffffffffffa0,(secp256k1_fe *)CONCAT44(a,in_stack_ffffffffffffff98)
                    );
  }
  return;
}

Assistant:

static void run_sqr(void) {
    secp256k1_fe x, s;

    {
        int i;
        secp256k1_fe_set_int(&x, 1);
        secp256k1_fe_negate(&x, &x, 1);

        for (i = 1; i <= 512; ++i) {
            secp256k1_fe_mul_int(&x, 2);
            secp256k1_fe_normalize(&x);
            secp256k1_fe_sqr(&s, &x);
        }
    }
}